

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputBuffer.cpp
# Opt level: O2

void __thiscall antlr::InputBuffer::fill(InputBuffer *this,uint amount)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  syncConsume(this);
  while (((long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->queue).storage.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2) - (this->queue).m_offset <
         (ulong)(this->markerOffset + amount)) {
    iVar1 = (*this->_vptr_InputBuffer[5])(this);
    uStack_28 = CONCAT44(iVar1,(undefined4)uStack_28);
    std::vector<int,_std::allocator<int>_>::push_back
              (&(this->queue).storage,(value_type_conflict1 *)((long)&uStack_28 + 4));
  }
  return;
}

Assistant:

void InputBuffer::fill(unsigned int amount)
{
	syncConsume();

	// Fill the buffer sufficiently to hold needed characters
	while (queue.entries() < amount + markerOffset)
        {         
            // Append the next character
            queue.append(getChar());            
	}
}